

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O1

_Bool get_move_flee(monster *mon)

{
  loc lVar1;
  ulong uVar2;
  _Bool _Var3;
  wchar_t wVar4;
  int iVar5;
  loc grid;
  int iVar6;
  long lVar7;
  bool bVar8;
  int local_44;
  ulong local_40;
  loc local_38;
  
  local_38 = (loc)loc(0,0);
  _Var3 = monster_taking_terrain_damage((chunk *)cave,(monster_conflict *)mon);
  if (!_Var3) {
    local_40 = (ulong)mon->cdis;
    if (mon->best_range <= mon->cdis) goto LAB_00182471;
    _Var3 = monster_can_hear(mon);
    if (!_Var3) {
      _Var3 = monster_can_smell(mon);
      local_40 = (ulong)_Var3;
      if (!_Var3) goto LAB_00182471;
    }
  }
  local_40 = (ulong)local_38 >> 0x20;
  local_44 = -1;
  lVar7 = 7;
  do {
    grid = (loc)loc_sum(mon->grid,(loc_conflict)ddgrid_ddd[lVar7]);
    _Var3 = square_in_bounds(cave,grid);
    uVar2 = local_40;
    if (_Var3) {
      wVar4 = distance((loc_conflict)grid,(mon->target).grid);
      iVar6 = (int)(5000 / (long)(wVar4 + L'\x03')) -
              (int)(500 / (ulong)((cave->noise).grids[(long)grid >> 0x20][grid.x] + 1));
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      lVar1 = grid;
      if (iVar6 < local_44) {
        lVar1 = local_38;
      }
      local_38 = (loc)((ulong)lVar1 & 0xffffffff);
      iVar5 = local_44;
      if (local_44 < iVar6) {
        iVar5 = iVar6;
      }
      bVar8 = iVar6 < local_44;
      local_44 = iVar5;
      uVar2 = (ulong)grid >> 0x20;
      if (bVar8) {
        uVar2 = local_40;
      }
    }
    local_40 = uVar2;
    bVar8 = lVar7 != 0;
    lVar7 = lVar7 + -1;
  } while (bVar8);
  (mon->target).grid.x = local_38.x;
  (mon->target).grid.y = (int)local_40;
LAB_00182471:
  return SUB81(local_40,0);
}

Assistant:

static bool get_move_flee(struct monster *mon)
{
	int i;
	struct loc best = loc(0, 0);
	int best_score = -1;

	/* Taking damage from terrain makes moving vital */
	if (!monster_taking_terrain_damage(cave, mon)) {
		/* If the player is not currently near the monster, no reason to flow */
		if (mon->cdis >= mon->best_range) {
			return false;
		}

		/* Monster is too far away to use sound or scent */
		if (!monster_can_hear(mon) && !monster_can_smell(mon)) {
			return false;
		}
	}

	/* Check nearby grids, diagonals first */
	for (i = 7; i >= 0; i--) {
		int dis, score;

		/* Get the location */
		struct loc grid = loc_sum(mon->grid, ddgrid_ddd[i]);

		/* Bounds check */
		if (!square_in_bounds(cave, grid)) continue;

		/* Calculate distance of this grid from our target */
		dis = distance(grid, mon->target.grid);

		/* Score this grid
		 * First half of calculation is inversely proportional to distance
		 * Second half is inversely proportional to grid's distance from player
		 */
		score = 5000 / (dis + 3) - 500 /(cave->noise.grids[grid.y][grid.x] + 1);

		/* No negative scores */
		if (score < 0) score = 0;

		/* Ignore lower scores */
		if (score < best_score) continue;

		/* Save the score */
		best_score = score;

		/* Save the location */
		best = grid;
	}

	/* Set the immediate target */
	mon->target.grid = best;

	/* Success */
	return true;
}